

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  ImGuiContext *g;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  
  fVar3 = (GImGui->Style).DisplaySafeAreaPadding.x;
  fVar4 = (GImGui->Style).DisplaySafeAreaPadding.y;
  fVar1 = (GImGui->IO).DisplaySize.x;
  fVar2 = (GImGui->IO).DisplaySize.y;
  fVar3 = (float)(-(uint)(fVar3 + fVar3 < fVar1) & (uint)-fVar3);
  fVar4 = (float)(-(uint)(fVar4 + fVar4 < fVar2) & (uint)-fVar4);
  IVar5.Min.x = 0.0 - fVar3;
  IVar5.Min.y = 0.0 - fVar4;
  IVar5.Max.x = fVar3 + fVar1;
  IVar5.Max.y = fVar4 + fVar2;
  return IVar5;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    IM_UNUSED(window);
    ImVec2 padding = GImGui->Style.DisplaySafeAreaPadding;
    ImRect r_screen = GetViewportRect();
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}